

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer * Serialize<FFont>(FSerializer *arc,char *key,FFont **font,FFont **def)

{
  FFont *pFVar1;
  char *n;
  char *local_20;
  
  if (arc->w == (FWriter *)0x0) {
    FSerializer::StringPtr(arc,key,&local_20);
    pFVar1 = V_GetFont(local_20);
    *font = pFVar1;
    if (pFVar1 == (FFont *)0x0) {
      Printf("\x1cICould not load font %s\n",local_20);
      *font = SmallFont;
    }
  }
  else {
    local_20 = (*font)->Name;
    FSerializer::StringPtr(arc,key,&local_20);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FFont *&font, FFont **def)
{
	if (arc.isWriting())
	{
		const char *n = font->GetName();
		return arc.StringPtr(key, n);
	}
	else
	{
		const char *n;
		arc.StringPtr(key, n);
		font = V_GetFont(n);
		if (font == nullptr)
		{
			Printf(TEXTCOLOR_ORANGE "Could not load font %s\n", n);
			font = SmallFont;
		}
		return arc;
	}

}